

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlCtxtUseOptions(xmlParserCtxtPtr ctxt,int options)

{
  int iVar1;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return -1;
  }
  if (ctxt->html != 0) {
    iVar1 = htmlCtxtUseOptions(ctxt,options);
    return iVar1;
  }
  iVar1 = xmlCtxtSetOptionsInternal(ctxt,options,0x7b6860);
  return iVar1;
}

Assistant:

int
xmlCtxtUseOptions(xmlParserCtxtPtr ctxt, int options)
{
    int keepMask;

#ifdef LIBXML_HTML_ENABLED
    if ((ctxt != NULL) && (ctxt->html))
        return(htmlCtxtUseOptions(ctxt, options));
#endif

    /*
     * For historic reasons, some options can only be enabled.
     */
    keepMask = XML_PARSE_NOERROR |
               XML_PARSE_NOWARNING |
               XML_PARSE_NONET |
               XML_PARSE_NSCLEAN |
               XML_PARSE_NOCDATA |
               XML_PARSE_COMPACT |
               XML_PARSE_OLD10 |
               XML_PARSE_HUGE |
               XML_PARSE_OLDSAX |
               XML_PARSE_IGNORE_ENC |
               XML_PARSE_BIG_LINES;

    return(xmlCtxtSetOptionsInternal(ctxt, options, keepMask));
}